

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall dxil_spv::Converter::Impl::emit_patch_variables(Impl *this)

{
  undefined4 uVar1;
  Builder *pBVar2;
  bool bVar3;
  uint uVar4;
  Id IVar5;
  Id IVar6;
  MDOperand *pMVar7;
  Module *module;
  MDNode *node_00;
  MDNode *node_01;
  uint *puVar8;
  char *name;
  Decoration decoration;
  uint *t;
  bool local_169;
  char *pcStack_148;
  Id type_id_1;
  D3DStageIO d3d_io;
  VulkanStageIO vk_io;
  Id variable_id;
  undefined1 local_100 [8];
  String variable_name;
  Id type_id;
  undefined1 uStack_d4;
  undefined3 uStack_d3;
  undefined8 local_d0;
  Id local_c8;
  bool local_c4;
  BuiltIn local_c0;
  uint local_bc;
  BuiltIn builtin;
  uint semantic_offset;
  mapped_type *meta;
  uint local_a8;
  uint local_a4;
  uint start_col;
  uint start_row;
  uint cols;
  uint rows;
  uint semantic_index;
  Semantic system_value;
  ComponentType effective_element_type;
  ComponentType actual_element_type;
  String semantic_name;
  uint element_id;
  MDNode *patch;
  uint local_58;
  uint i;
  uint num_broken_user_rows;
  StorageClass storage;
  Builder *builder;
  MDNode *patch_node;
  MDOperand *pMStack_38;
  bool broken_patch_variables;
  MDOperand *patch_variables;
  MDNode *signature_node;
  MDOperand *signature;
  MDNode *node;
  Impl *this_local;
  
  signature = &this->entry_point_meta->super_MDOperand;
  node = (MDNode *)this;
  pMVar7 = LLVMBC::MDNode::getOperand((MDNode *)signature,2);
  bVar3 = LLVMBC::MDOperand::operator_cast_to_bool(pMVar7);
  if (bVar3) {
    signature_node = (MDNode *)LLVMBC::MDNode::getOperand((MDNode *)signature,2);
    patch_variables = &LLVMBC::cast<LLVMBC::MDNode>((MDOperand *)signature_node)->super_MDOperand;
    pMStack_38 = LLVMBC::MDNode::getOperand((MDNode *)patch_variables,2);
    bVar3 = LLVMBC::MDOperand::operator_cast_to_bool(pMStack_38);
    if (bVar3) {
      patch_node._7_1_ = false;
      if (this->execution_model == ExecutionModelTessellationControl) {
        module = LLVMBCParser::get_module(this->bitcode_parser);
        patch_node._7_1_ = module_is_dxilconv(module);
      }
      builder = (Builder *)LLVMBC::dyn_cast<LLVMBC::MDNode>(pMStack_38);
      _num_broken_user_rows = SPIRVModule::get_builder(this->spirv_module);
      i = 3;
      if (this->execution_model == ExecutionModelTessellationEvaluation) {
        i = 1;
      }
      local_58 = 0;
      for (patch._4_4_ = 0; uVar4 = LLVMBC::MDNode::getNumOperands((MDNode *)builder),
          pBVar2 = _num_broken_user_rows, patch._4_4_ < uVar4; patch._4_4_ = patch._4_4_ + 1) {
        pMVar7 = LLVMBC::MDNode::getOperand((MDNode *)builder,patch._4_4_);
        node_00 = LLVMBC::cast<LLVMBC::MDNode>(pMVar7);
        semantic_name.field_2._12_4_ = get_constant_metadata<unsigned_int>(node_00,0);
        get_string_metadata_abi_cxx11_
                  ((String *)&semantic_index,(dxil_spv *)node_00,(MDNode *)0x1,uVar4);
        uVar4 = get_constant_metadata<unsigned_int>(node_00,2);
        rows._3_1_ = normalize_component_type((ComponentType)uVar4);
        rows._2_1_ = get_effective_input_output_type(this,rows._3_1_);
        uVar4 = get_constant_metadata<unsigned_int>(node_00,3);
        rows._1_1_ = (Semantic)uVar4;
        cols = 0;
        pMVar7 = LLVMBC::MDNode::getOperand(node_00,4);
        bVar3 = LLVMBC::MDOperand::operator_cast_to_bool(pMVar7);
        if (bVar3) {
          pMVar7 = LLVMBC::MDNode::getOperand(node_00,4);
          node_01 = LLVMBC::cast<LLVMBC::MDNode>(pMVar7);
          cols = get_constant_metadata<unsigned_int>(node_01,0);
        }
        start_row = get_constant_metadata<unsigned_int>(node_00,6);
        start_col = get_constant_metadata<unsigned_int>(node_00,7);
        local_a4 = get_constant_metadata<unsigned_int>(node_00,8);
        local_a8 = get_constant_metadata<unsigned_int>(node_00,9);
        if (rows._1_1_ == TessFactor) {
          start_row = 4;
        }
        else if (rows._1_1_ == InsideTessFactor) {
          start_row = 2;
        }
        if (((patch_node._7_1_ & 1) != 0) && (rows._1_1_ == User)) {
          meta._4_4_ = local_a4 + start_row;
          puVar8 = std::max<unsigned_int>(&local_58,(uint *)((long)&meta + 4));
          local_58 = *puVar8;
        }
        _builtin = std::
                   unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>_>
                   ::operator[](&this->patch_elements_meta,
                                (key_type *)(semantic_name.field_2._M_local_buf + 0xc));
        local_bc = 0;
        if ((rows._1_1_ == TessFactor) || (rows._1_1_ == InsideTessFactor)) {
          local_c0 = BuiltInTessLevelInner;
          if (rows._1_1_ == TessFactor) {
            local_c0 = BuiltInTessLevelOuter;
          }
          bVar3 = SPIRVModule::has_builtin_shader_input(this->spirv_module,local_c0);
          if (!bVar3) goto LAB_00141f04;
          memset(&type_id,0,0x18);
          (_builtin->super_ElementMeta).id = type_id;
          (_builtin->super_ElementMeta).component_type = uStack_d4;
          *(undefined3 *)&(_builtin->super_ElementMeta).field_0x5 = uStack_d3;
          *(undefined8 *)&(_builtin->super_ElementMeta).semantic_offset = local_d0;
          _builtin->start_col = local_c8;
          _builtin->lowering = local_c4;
          IVar5 = SPIRVModule::get_builtin_shader_input(this->spirv_module,local_c0);
          (_builtin->super_ElementMeta).id = IVar5;
          (_builtin->super_ElementMeta).component_type = rows._3_1_;
          (_builtin->super_ElementMeta).semantic_offset = local_a4;
          variable_name.field_2._12_4_ = 4;
        }
        else {
LAB_00141f04:
          if (rows._1_1_ == CullPrimitive) {
            variable_name.field_2._8_4_ = spv::Builder::makeBoolType(_num_broken_user_rows);
          }
          else {
            variable_name.field_2._8_4_ = get_type_id(this,rows._2_1_,start_row,start_col,false);
          }
          pBVar2 = _num_broken_user_rows;
          uVar1 = variable_name.field_2._8_4_;
          if (this->execution_model == ExecutionModelMeshEXT) {
            IVar5 = spv::Builder::makeUintConstant
                              (_num_broken_user_rows,
                               (this->execution_mode_meta).stage_output_num_primitive,false);
            variable_name.field_2._8_4_ = spv::Builder::makeArrayType(pBVar2,uVar1,IVar5,0);
          }
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)local_100,
                       (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)&semantic_index);
          if (cols != 0) {
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)local_100,"_");
            to_string<unsigned_int&>((String *)&vk_io.flags,(dxil_spv *)&cols,t);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)local_100,
                       (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)&vk_io.flags);
            std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                           *)&vk_io.flags);
          }
          uVar4 = i;
          uVar1 = variable_name.field_2._8_4_;
          name = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                        *)local_100);
          vk_io.component = create_variable(this,uVar4,uVar1,name);
          (_builtin->super_ElementMeta).id = vk_io.component;
          (_builtin->super_ElementMeta).component_type = rows._3_1_;
          (_builtin->super_ElementMeta).semantic_offset = local_bc;
          _builtin->start_row = local_a4;
          _builtin->start_col = local_a8;
          local_169 = (patch_node._7_1_ & 1) != 0 && rows._1_1_ == User;
          _builtin->lowering = local_169;
          if (rows._1_1_ == User) {
            d3d_io.rows = local_a4 + this->patch_location_offset;
            d3d_io._20_4_ = local_a8;
            vk_io.location = 1;
            if (this->resource_mapping_iface == (ResourceRemappingInterface *)0x0) {
LAB_001421f4:
              spv::Builder::addDecoration
                        (_num_broken_user_rows,vk_io.component,DecorationLocation,d3d_io.rows);
              if (d3d_io._20_4_ != 0) {
                spv::Builder::addDecoration
                          (_num_broken_user_rows,vk_io.component,DecorationComponent,d3d_io._20_4_);
              }
              goto LAB_00142233;
            }
            pcStack_148 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                          ::c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                                   *)&semantic_index);
            d3d_io.semantic._0_4_ = cols;
            d3d_io.semantic._4_4_ = local_a4;
            d3d_io.semantic_index = start_row;
            if (this->execution_model == ExecutionModelTessellationEvaluation) {
              uVar4 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[8])
                                (this->resource_mapping_iface,&stack0xfffffffffffffeb8,&d3d_io.rows)
              ;
              if ((uVar4 & 1) != 0) goto LAB_001421f4;
              this_local._7_1_ = 0;
              variable_name.field_2._12_4_ = 1;
            }
            else {
              uVar4 = (*this->resource_mapping_iface->_vptr_ResourceRemappingInterface[9])
                                (this->resource_mapping_iface,&stack0xfffffffffffffeb8,&d3d_io.rows)
              ;
              if ((uVar4 & 1) != 0) goto LAB_001421f4;
              this_local._7_1_ = 0;
              variable_name.field_2._12_4_ = 1;
            }
          }
          else {
            emit_builtin_decoration(this,vk_io.component,rows._1_1_,i);
LAB_00142233:
            decoration = DecorationPatch;
            if (this->execution_model == ExecutionModelMeshEXT) {
              decoration = DecorationPerPrimitiveEXT;
            }
            spv::Builder::addDecoration(_num_broken_user_rows,vk_io.component,decoration,-1);
            variable_name.field_2._12_4_ = 0;
          }
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                         *)local_100);
        }
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                       *)&semantic_index);
        if ((variable_name.field_2._12_4_ != 0) && (variable_name.field_2._12_4_ == 1))
        goto LAB_0014237d;
      }
      if (local_58 != 0) {
        IVar5 = spv::Builder::makeUintType(_num_broken_user_rows,0x20);
        IVar5 = spv::Builder::makeVectorType(pBVar2,IVar5,4);
        IVar6 = spv::Builder::makeUintConstant(_num_broken_user_rows,local_58,false);
        IVar5 = spv::Builder::makeArrayType(pBVar2,IVar5,IVar6,0);
        IVar6 = spv::Builder::makeNullConstant(_num_broken_user_rows,IVar5);
        IVar5 = create_variable_with_initializer
                          (this,StorageClassPrivate,IVar5,IVar6,"PatchLoweringRows");
        (this->execution_mode_meta).patch_lowering_array_var_id = IVar5;
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_0014237d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Converter::Impl::emit_patch_variables()
{
	auto *node = entry_point_meta;

	if (!node->getOperand(2))
		return true;

	auto &signature = node->getOperand(2);
	auto *signature_node = llvm::cast<llvm::MDNode>(signature);
	auto &patch_variables = signature_node->getOperand(2);
	if (!patch_variables)
		return true;

	// dxilconv is broken and emits patch the fork phase in a way that is non-sensical.
	// It assumes that you can write outside the bounds of a signature element.
	// To make this work, we need to lower the patch constant variables from Private variables instead.
	bool broken_patch_variables = false;
	if (execution_model == spv::ExecutionModelTessellationControl)
		broken_patch_variables = module_is_dxilconv(bitcode_parser.get_module());

	auto *patch_node = llvm::dyn_cast<llvm::MDNode>(patch_variables);

	auto &builder = spirv_module.get_builder();

	spv::StorageClass storage =
	    execution_model == spv::ExecutionModelTessellationEvaluation ? spv::StorageClassInput : spv::StorageClassOutput;

	unsigned num_broken_user_rows = 0;

	for (unsigned i = 0; i < patch_node->getNumOperands(); i++)
	{
		auto *patch = llvm::cast<llvm::MDNode>(patch_node->getOperand(i));
		auto element_id = get_constant_metadata(patch, 0);
		auto semantic_name = get_string_metadata(patch, 1);
		auto actual_element_type = normalize_component_type(static_cast<DXIL::ComponentType>(get_constant_metadata(patch, 2)));
		auto effective_element_type = get_effective_input_output_type(actual_element_type);
		auto system_value = static_cast<DXIL::Semantic>(get_constant_metadata(patch, 3));

		unsigned semantic_index = 0;
		if (patch->getOperand(4))
			semantic_index = get_constant_metadata(llvm::cast<llvm::MDNode>(patch->getOperand(4)), 0);

		auto rows = get_constant_metadata(patch, 6);
		auto cols = get_constant_metadata(patch, 7);

		auto start_row = get_constant_metadata(patch, 8);
		auto start_col = get_constant_metadata(patch, 9);

		if (system_value == DXIL::Semantic::TessFactor)
			rows = 4;
		else if (system_value == DXIL::Semantic::InsideTessFactor)
			rows = 2;

		if (broken_patch_variables && system_value == DXIL::Semantic::User)
			num_broken_user_rows = std::max<unsigned>(num_broken_user_rows, start_row + rows);

		auto &meta = patch_elements_meta[element_id];

		// Handle case where shader declares the tess factors twice at different offsets.
		unsigned semantic_offset = 0;
		if (system_value == DXIL::Semantic::TessFactor || system_value == DXIL::Semantic::InsideTessFactor)
		{
			auto builtin = system_value == DXIL::Semantic::TessFactor ?
			               spv::BuiltInTessLevelOuter : spv::BuiltInTessLevelInner;
			if (spirv_module.has_builtin_shader_input(builtin))
			{
				meta = {};
				meta.id = spirv_module.get_builtin_shader_input(builtin);
				meta.component_type = actual_element_type;
				meta.semantic_offset = start_row;
				continue;
			}
		}

		spv::Id type_id;

		if (system_value == DXIL::Semantic::CullPrimitive)
			type_id = builder.makeBoolType();
		else
			type_id = get_type_id(effective_element_type, rows, cols);

		if (execution_model == spv::ExecutionModelMeshEXT)
		{
			type_id = builder.makeArrayType(
				type_id, builder.makeUintConstant(execution_mode_meta.stage_output_num_primitive, false), 0);
		}

		auto variable_name = semantic_name;
		if (semantic_index != 0)
		{
			variable_name += "_";
			variable_name += dxil_spv::to_string(semantic_index);
		}

		spv::Id variable_id = create_variable(storage, type_id, variable_name.c_str());
		meta.id = variable_id;
		meta.component_type = actual_element_type;
		meta.semantic_offset = semantic_offset;
		meta.start_row = start_row;
		meta.start_col = start_col;
		meta.lowering = broken_patch_variables && system_value == DXIL::Semantic::User;

		if (system_value != DXIL::Semantic::User)
		{
			emit_builtin_decoration(variable_id, system_value, storage);
		}
		else
		{
			// Patch constants are packed together with control point variables,
			// so we need to apply an offset to make this work in SPIR-V.
			// The offset is deduced from the control point I/O signature.
			// TODO: If it's possible to omit trailing CP members in domain shader, we will need to pass this offset
			// into the compiler.
			VulkanStageIO vk_io = { start_row + patch_location_offset, start_col, true };

			if (resource_mapping_iface)
			{
				D3DStageIO d3d_io = { semantic_name.c_str(), semantic_index, start_row, rows };

				if (execution_model == spv::ExecutionModelTessellationEvaluation)
				{
					if (!resource_mapping_iface->remap_stage_input(d3d_io, vk_io))
						return false;
				}
				else if (!resource_mapping_iface->remap_stage_output(d3d_io, vk_io))
					return false;
			}

			builder.addDecoration(variable_id, spv::DecorationLocation, vk_io.location);
			if (vk_io.component != 0)
				builder.addDecoration(variable_id, spv::DecorationComponent, vk_io.component);
		}

		builder.addDecoration(variable_id, execution_model == spv::ExecutionModelMeshEXT
		                                   ? spv::DecorationPerPrimitiveEXT : spv::DecorationPatch);
	}

	if (num_broken_user_rows)
	{
		spv::Id type_id = builder.makeArrayType(builder.makeVectorType(builder.makeUintType(32), 4),
		                                        builder.makeUintConstant(num_broken_user_rows), 0);
		execution_mode_meta.patch_lowering_array_var_id =
			create_variable_with_initializer(spv::StorageClassPrivate, type_id,
			                                 builder.makeNullConstant(type_id),
			                                 "PatchLoweringRows");
	}

	return true;
}